

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_haxe_generator.cc
# Opt level: O1

string * __thiscall
t_haxe_generator::function_signature_normal_abi_cxx11_
          (string *__return_storage_ptr__,t_haxe_generator *this,t_function *tfunction)

{
  long lVar1;
  int iVar2;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  string resulttype;
  string arguments;
  string local_e8;
  undefined1 *local_c8;
  char *local_c0;
  undefined1 local_b8 [16];
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  argument_list_abi_cxx11_(&local_68,this,tfunction->arglist_);
  local_c0 = (char *)0x0;
  local_b8[0] = 0;
  local_c8 = local_b8;
  if (tfunction->oneway_ == false) {
    iVar2 = (*(tfunction->returntype_->super_t_doc)._vptr_t_doc[4])();
    if ((char)iVar2 == '\0') {
      type_name_abi_cxx11_(&local_e8,this,tfunction->returntype_,false,false);
      std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      goto LAB_0022f826;
    }
  }
  std::__cxx11::string::_M_replace((ulong)&local_c8,0,local_c0,0x38d1ef);
LAB_0022f826:
  std::operator+(&local_48,"function ",&tfunction->name_);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_48);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_98 = *plVar4;
    lStack_90 = plVar3[3];
    local_a8 = &local_98;
  }
  else {
    local_98 = *plVar4;
    local_a8 = (long *)*plVar3;
  }
  local_a0 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_a8,(ulong)local_68._M_dataplus._M_p);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_78 = *plVar4;
    lStack_70 = plVar3[3];
    local_88 = &local_78;
  }
  else {
    local_78 = *plVar4;
    local_88 = (long *)*plVar3;
  }
  local_80 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_88);
  psVar5 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_e8.field_2._M_allocated_capacity = *psVar5;
    local_e8.field_2._8_8_ = plVar3[3];
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  }
  else {
    local_e8.field_2._M_allocated_capacity = *psVar5;
    local_e8._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_e8._M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_c8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar5 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar5) {
    lVar1 = plVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  if (local_88 != &local_78) {
    operator_delete(local_88);
  }
  if (local_a8 != &local_98) {
    operator_delete(local_a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (local_c8 != local_b8) {
    operator_delete(local_c8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_haxe_generator::function_signature_normal(t_function* tfunction) {
  std::string arguments = argument_list(tfunction->get_arglist());

  std::string resulttype;
  if (tfunction->is_oneway() || tfunction->get_returntype()->is_void()) {
    resulttype = "Void";
  } else {
    resulttype = type_name(tfunction->get_returntype());
  }

  std::string result = "function " + tfunction->get_name() + "(" + arguments + ") : " + resulttype;
  return result;
}